

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

string * __thiscall Edge::GetUnescapedDepfile_abi_cxx11_(string *__return_storage_ptr__,Edge *this)

{
  EdgeEnv env;
  allocator<char> local_59;
  EdgeEnv local_58;
  string local_28;
  
  local_58.super_Env._vptr_Env = (_func_int **)&PTR__EdgeEnv_00133ad8;
  local_58.lookups_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.lookups_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.lookups_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.escape_in_out_ = kDoNotEscape;
  local_58.recursive_ = false;
  local_58.edge_ = this;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"depfile",&local_59);
  EdgeEnv::LookupVariable(__return_storage_ptr__,&local_58,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  EdgeEnv::~EdgeEnv(&local_58);
  return __return_storage_ptr__;
}

Assistant:

string Edge::GetUnescapedDepfile() const {
  EdgeEnv env(this, EdgeEnv::kDoNotEscape);
  return env.LookupVariable("depfile");
}